

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void sig_handler(int signum)

{
  TTTGame *this;
  int iVar1;
  list<TTTGame_*,_std::allocator<TTTGame_*>_> *plVar2;
  undefined1 local_60 [48];
  
  if ((signum != 0xf) && (signum != 2)) {
    printf("Unrecognized signal captured: %d",(ulong)(uint)signum);
    return;
  }
  close(server_sock);
  plVar2 = &game_list_abi_cxx11_;
  while (plVar2 = (list<TTTGame_*,_std::allocator<TTTGame_*>_> *)
                  (plVar2->super__List_base<TTTGame_*,_std::allocator<TTTGame_*>_>)._M_impl._M_node.
                  super__List_node_base._M_next, plVar2 != &game_list_abi_cxx11_) {
    TTTGame::GetPlayer1((Player *)local_60,*(TTTGame **)((long)plVar2 + 0x10));
    iVar1 = Player::GetSocket((Player *)local_60);
    close(iVar1);
    std::__cxx11::string::~string((string *)(local_60 + 8));
    TTTGame::GetPlayer2((Player *)local_60,*(TTTGame **)((long)plVar2 + 0x10));
    iVar1 = Player::GetSocket((Player *)local_60);
    close(iVar1);
    std::__cxx11::string::~string((string *)(local_60 + 8));
    this = *(TTTGame **)((long)plVar2 + 0x10);
    if (this != (TTTGame *)0x0) {
      TTTGame::~TTTGame(this);
    }
    operator_delete(this);
  }
  std::__cxx11::list<TTTGame_*,_std::allocator<TTTGame_*>_>::clear(&game_list_abi_cxx11_);
  puts("Exiting server");
  exit(0);
}

Assistant:

void sig_handler(int signum)
{
    switch(signum)
    {
        case SIGTERM:
        case SIGINT:
            close(server_sock);

            // Dynamically delete every game in the list and close every connected client
            for(auto iter = game_list.begin(); iter != game_list.end(); ++iter)
            {
                close((*iter)->GetPlayer1().GetSocket());
                close((*iter)->GetPlayer2().GetSocket());

                // Remove the game
                delete *iter;
            }

            game_list.clear();

            printf("Exiting server\n");
            exit(0);
            break;
        default: printf("Unrecognized signal captured: %d", signum);
    }
}